

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O2

Vec_Int_t * findHintOutputs(Abc_Ntk_t *pNtk)

{
  Vec_Int_t *p;
  Abc_Obj_t *pObj;
  char *pcVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  p = Vec_IntAlloc((int)pNtk);
  for (i = 0; i < pNtk->vPos->nSize; i = i + 1) {
    pObj = Abc_NtkPo(pNtk,i);
    pcVar1 = Abc_ObjName(pObj);
    pcVar1 = strstr(pcVar1,"hint_");
    if (pcVar1 != (char *)0x0) {
      Vec_IntPush(p,i);
      iVar2 = iVar2 + 1;
    }
  }
  if (iVar2 == 0) {
    p = (Vec_Int_t *)0x0;
  }
  return p;
}

Assistant:

Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk)
{
	int i, numElementPush = 0;
	Abc_Obj_t *pNode;
	Vec_Int_t *vHintPoIntdex;

	vHintPoIntdex = Vec_IntAlloc(0);
	Abc_NtkForEachPo( pNtk, pNode, i )
	{
		if( strstr( Abc_ObjName( pNode ), "hint_" ) != NULL )
		{
			Vec_IntPush( vHintPoIntdex, i );
			numElementPush++;
		}
	}	
	
	if( numElementPush == 0 )
		return NULL;
	else
		return vHintPoIntdex;
}